

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  int start;
  void **ppvVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  uint num;
  int iVar7;
  
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar3 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  start = (int)((ulong)((long)first.it_ - (long)ppvVar3) >> 3);
  iVar7 = (int)((ulong)((long)last.it_ - (long)ppvVar3) >> 3);
  num = iVar7 - start;
  if (num != 0 && start <= iVar7) {
    uVar6 = (ulong)num;
    lVar5 = (long)start;
    do {
      puVar2 = (undefined8 *)((this->super_RepeatedPtrFieldBase).rep_)->elements[lVar5];
      if ((puVar2 != (undefined8 *)0x0) &&
         ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0)) {
        if ((undefined8 *)*puVar2 != puVar2 + 2) {
          operator_delete((undefined8 *)*puVar2);
        }
        operator_delete(puVar2);
      }
      uVar6 = uVar6 - 1;
      lVar5 = lVar5 + 1;
    } while (uVar6 != 0);
    if (0 < (int)num) {
      internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
    }
  }
  pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar4 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar4 = (void **)0x0;
  }
  return (iterator)
         (void **)((((long)first.it_ - (long)ppvVar3) * 0x20000000 >> 0x1d) + (long)ppvVar4);
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last) {
  size_type pos_offset = std::distance(cbegin(), first);
  size_type last_offset = std::distance(cbegin(), last);
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}